

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

string * __thiscall
Jupiter::Socket::resolveHostname_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,addrinfo *addr)

{
  allocator<char> local_429;
  char local_428 [8];
  char resolved [1025];
  addrinfo *addr_local;
  
  getnameinfo((sockaddr *)this[1].m_data,*(socklen_t *)&this[1]._vptr_Socket,local_428,0x401,
              (char *)0x0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_428,&local_429);
  std::allocator<char>::~allocator(&local_429);
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveHostname(addrinfo *addr) { // static
	char resolved[NI_MAXHOST];
	getnameinfo(addr->ai_addr, addr->ai_addrlen, resolved, sizeof(resolved), 0, 0, 0);
	return resolved;
}